

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O0

RPCHelpMan * gettxspendingprevout(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffee78;
  allocator<RPCArg> *paVar2;
  allocator<RPCResult> *this;
  RPCArg *this_00;
  anon_class_1_0_00000001 *in_stack_ffffffffffffee80;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffee88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeeb0;
  allocator<char> *in_stack_ffffffffffffeeb8;
  char *in_stack_ffffffffffffeec0;
  undefined7 in_stack_ffffffffffffeec8;
  undefined1 in_stack_ffffffffffffeecf;
  string *in_stack_ffffffffffffeed0;
  undefined7 in_stack_ffffffffffffeed8;
  undefined1 in_stack_ffffffffffffeedf;
  undefined4 in_stack_ffffffffffffeee0;
  Type in_stack_ffffffffffffeee4;
  string *in_stack_ffffffffffffeee8;
  undefined4 in_stack_ffffffffffffeef0;
  Type in_stack_ffffffffffffeef4;
  undefined4 in_stack_ffffffffffffeef8;
  Type in_stack_ffffffffffffeefc;
  RPCArg *in_stack_ffffffffffffef00;
  RPCArgOptions *in_stack_ffffffffffffef20;
  undefined1 *local_10a0;
  undefined1 *local_1088;
  undefined1 *local_1070;
  undefined1 *local_1058;
  RPCExamples *in_stack_ffffffffffffefc0;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_01;
  RPCHelpMan *fun;
  undefined1 local_e60 [34];
  undefined1 local_e3e;
  undefined1 local_e3d;
  undefined1 local_e3c;
  undefined1 local_e3b [34];
  allocator<char> local_e19 [31];
  allocator<char> local_dfa;
  allocator<char> local_df9 [39];
  allocator<char> local_dd2;
  allocator<char> local_dd1 [31];
  allocator<char> local_db2;
  allocator<char> local_db1 [31];
  allocator<char> local_d92;
  allocator<char> local_d91 [32];
  allocator<char> local_d71;
  undefined4 local_d70;
  allocator<char> local_d6a;
  allocator<char> local_d69;
  undefined4 local_d68;
  allocator<char> local_d61 [32];
  allocator<char> local_d41;
  undefined4 local_d40;
  allocator<char> local_d39 [32];
  allocator<char> local_d19;
  undefined4 local_d18;
  allocator<char> local_d11 [31];
  allocator<char> local_cf2;
  allocator<char> local_cf1 [449];
  undefined1 local_b30 [408];
  undefined1 local_998 [64];
  undefined1 local_958 [136];
  undefined1 local_8d0 [200];
  allocator<RPCArg> local_808 [40];
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined1 local_7c8;
  undefined1 local_7c7;
  allocator<RPCArg> local_7c0 [40];
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined1 local_780;
  undefined1 local_77f;
  undefined1 local_778;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined1 local_738;
  undefined1 local_737;
  undefined1 local_690;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined1 local_650;
  undefined1 local_64f;
  undefined1 local_5a8 [528];
  undefined1 local_398 [160];
  undefined1 local_2f8 [264];
  undefined1 local_1f0 [160];
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  fun = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8),in_stack_ffffffffffffeec0
             ,in_stack_ffffffffffffeeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8),in_stack_ffffffffffffeec0
             ,in_stack_ffffffffffffeeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8),in_stack_ffffffffffffeec0
             ,in_stack_ffffffffffffeeb8);
  local_d18 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffee88,(Optional *)in_stack_ffffffffffffee80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8),in_stack_ffffffffffffeec0
             ,in_stack_ffffffffffffeeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8),in_stack_ffffffffffffeec0
             ,in_stack_ffffffffffffeeb8);
  local_d40 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffee88,(Optional *)in_stack_ffffffffffffee80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8),in_stack_ffffffffffffeec0
             ,in_stack_ffffffffffffeeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8),in_stack_ffffffffffffeec0
             ,in_stack_ffffffffffffeeb8);
  local_d68 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffee88,(Optional *)in_stack_ffffffffffffee80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8),in_stack_ffffffffffffeec0
             ,in_stack_ffffffffffffeeb8);
  local_690 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffee90);
  local_668 = 0;
  uStack_660 = 0;
  local_658 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffee78);
  local_650 = 0;
  local_64f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffeef4,in_stack_ffffffffffffeef0),
                 in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffeedf,in_stack_ffffffffffffeed8),
                 in_stack_ffffffffffffeed0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8),in_stack_ffffffffffffeec0
             ,in_stack_ffffffffffffeeb8);
  local_d70 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffee88,(Optional *)in_stack_ffffffffffffee80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8),in_stack_ffffffffffffeec0
             ,in_stack_ffffffffffffeeb8);
  local_778 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffee90);
  local_750 = 0;
  uStack_748 = 0;
  local_740 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffee78);
  local_738 = 0;
  local_737 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffeef4,in_stack_ffffffffffffeef0),
                 in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffeedf,in_stack_ffffffffffffeed8),
                 in_stack_ffffffffffffeed0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffee78);
  __l._M_len._0_7_ = in_stack_ffffffffffffeec8;
  __l._M_array = (iterator)in_stack_ffffffffffffeec0;
  __l._M_len._7_1_ = in_stack_ffffffffffffeecf;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffeeb8,__l,
             (allocator_type *)in_stack_ffffffffffffeeb0);
  local_7c0[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffee90);
  local_798 = 0;
  uStack_790 = 0;
  local_788 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffee78);
  local_780 = 0;
  local_77f = 0;
  paVar2 = local_7c0;
  RPCArg::RPCArg(in_stack_ffffffffffffef00,
                 (string *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8),
                 in_stack_ffffffffffffeef4,(Fallback *)in_stack_ffffffffffffeee8,
                 (string *)CONCAT44(in_stack_ffffffffffffeee4,in_stack_ffffffffffffeee0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffeedf,in_stack_ffffffffffffeed8),
                 in_stack_ffffffffffffef20);
  std::allocator<RPCArg>::allocator(paVar2);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffeec8;
  __l_00._M_array = (iterator)in_stack_ffffffffffffeec0;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffeecf;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffeeb8,__l_00,
             (allocator_type *)in_stack_ffffffffffffeeb0);
  local_808[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffee90);
  local_7e0 = 0;
  uStack_7d8 = 0;
  local_7d0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_7c8 = 0;
  local_7c7 = 0;
  paVar2 = local_808;
  RPCArg::RPCArg(in_stack_ffffffffffffef00,
                 (string *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8),
                 in_stack_ffffffffffffeef4,(Fallback *)in_stack_ffffffffffffeee8,
                 (string *)CONCAT44(in_stack_ffffffffffffeee4,in_stack_ffffffffffffeee0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffeedf,in_stack_ffffffffffffeed8),
                 in_stack_ffffffffffffef20);
  std::allocator<RPCArg>::allocator(paVar2);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffeec8;
  __l_01._M_array = (iterator)in_stack_ffffffffffffeec0;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffeecf;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffeeb8,__l_01,
             (allocator_type *)in_stack_ffffffffffffeeb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8),in_stack_ffffffffffffeec0
             ,in_stack_ffffffffffffeeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8),in_stack_ffffffffffffeec0
             ,in_stack_ffffffffffffeeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8),in_stack_ffffffffffffeec0
             ,in_stack_ffffffffffffeeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8),in_stack_ffffffffffffeec0
             ,in_stack_ffffffffffffeeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8),in_stack_ffffffffffffeec0
             ,in_stack_ffffffffffffeeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8),in_stack_ffffffffffffeec0
             ,in_stack_ffffffffffffeeb8);
  local_df9._1_8_ = 0;
  local_df9._9_8_ = 0;
  local_df9[0x11] = (allocator<char>)0x0;
  local_df9[0x12] = (allocator<char>)0x0;
  local_df9[0x13] = (allocator<char>)0x0;
  local_df9[0x14] = (allocator<char>)0x0;
  local_df9[0x15] = (allocator<char>)0x0;
  local_df9[0x16] = (allocator<char>)0x0;
  local_df9[0x17] = (allocator<char>)0x0;
  local_df9[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffef00,in_stack_ffffffffffffeefc,
             (string *)CONCAT44(in_stack_ffffffffffffeef4,in_stack_ffffffffffffeef0),
             in_stack_ffffffffffffeee8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffeee4,in_stack_ffffffffffffeee0),
             (bool)in_stack_ffffffffffffeedf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8),in_stack_ffffffffffffeec0
             ,in_stack_ffffffffffffeeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8),in_stack_ffffffffffffeec0
             ,in_stack_ffffffffffffeeb8);
  local_e19[1] = (allocator<char>)0x0;
  local_e19[2] = (allocator<char>)0x0;
  local_e19[3] = (allocator<char>)0x0;
  local_e19[4] = (allocator<char>)0x0;
  local_e19[5] = (allocator<char>)0x0;
  local_e19[6] = (allocator<char>)0x0;
  local_e19[7] = (allocator<char>)0x0;
  local_e19[8] = (allocator<char>)0x0;
  local_e19._9_8_ = 0;
  local_e19._17_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffef00,in_stack_ffffffffffffeefc,
             (string *)CONCAT44(in_stack_ffffffffffffeef4,in_stack_ffffffffffffeef0),
             in_stack_ffffffffffffeee8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffeee4,in_stack_ffffffffffffeee0),
             (bool)in_stack_ffffffffffffeedf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8),in_stack_ffffffffffffeec0
             ,in_stack_ffffffffffffeeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8),in_stack_ffffffffffffeec0
             ,in_stack_ffffffffffffeeb8);
  local_e3b._3_8_ = (pointer)0x0;
  local_e3b._11_8_ = (pointer)0x0;
  local_e3b._19_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  this = (allocator<RPCResult> *)((ulong)paVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8),
             in_stack_ffffffffffffeef4,in_stack_ffffffffffffeee8,
             SUB41(in_stack_ffffffffffffeee4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffeedf,in_stack_ffffffffffffeed8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeed0,
             (bool)in_stack_ffffffffffffeecf);
  std::allocator<RPCResult>::allocator(this);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffeec8;
  __l_02._M_array = (iterator)in_stack_ffffffffffffeec0;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffeecf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeeb8,__l_02,
             (allocator_type *)in_stack_ffffffffffffeeb0);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffef00,in_stack_ffffffffffffeefc,
             (string *)CONCAT44(in_stack_ffffffffffffeef4,in_stack_ffffffffffffeef0),
             in_stack_ffffffffffffeee8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffeee4,in_stack_ffffffffffffeee0),
             (bool)in_stack_ffffffffffffeedf);
  std::allocator<RPCResult>::allocator(this);
  __l_03._M_len._0_7_ = in_stack_ffffffffffffeec8;
  __l_03._M_array = (iterator)in_stack_ffffffffffffeec0;
  __l_03._M_len._7_1_ = in_stack_ffffffffffffeecf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeeb8,__l_03,
             (allocator_type *)in_stack_ffffffffffffeeb0);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffef00,in_stack_ffffffffffffeefc,
             (string *)CONCAT44(in_stack_ffffffffffffeef4,in_stack_ffffffffffffeef0),
             in_stack_ffffffffffffeee8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffeee4,in_stack_ffffffffffffeee0),
             (bool)in_stack_ffffffffffffeedf);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffeef4,in_stack_ffffffffffffeef0));
  this_01 = (RPCHelpMan *)local_e3b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8),in_stack_ffffffffffffeec0
             ,in_stack_ffffffffffffeeb8);
  name = (string *)&local_e3c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8),in_stack_ffffffffffffeec0
             ,in_stack_ffffffffffffeeb8);
  HelpExampleCli(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
  description = (string *)&local_e3d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8),in_stack_ffffffffffffeec0
             ,in_stack_ffffffffffffeeb8);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)&local_e3e;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeecf,in_stack_ffffffffffffeec8),in_stack_ffffffffffffeec0
             ,in_stack_ffffffffffffeeb8);
  HelpExampleRpc(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
  std::operator+(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x5e7fcc);
  this_00 = (RPCArg *)local_e60;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<gettxspendingprevout()::__0,void>(in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
  RPCHelpMan::RPCHelpMan
            (this_01,name,description,args,(RPCResults *)this_00,in_stack_ffffffffffffefc0,
             (RPCMethodImpl *)fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_e3e);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_e3d);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_e3c);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_e3b);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee88);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  puVar1 = local_8d0;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (puVar1 != local_958);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee88);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_1058 = local_998;
  do {
    local_1058 = local_1058 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_1058 != local_b30);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee88);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_e3b + 0x21));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_e19);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee88);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_dfa);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_df9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee88);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_dd2);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_dd1);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_db2);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_db1);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_d92);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_d91);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffee88);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_1070 = local_48;
  do {
    local_1070 = local_1070 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_1070 != local_150);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffee88);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_1088 = local_1f0;
  do {
    local_1088 = local_1088 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_1088 != local_2f8);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffee88);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_10a0 = local_398;
  do {
    local_10a0 = local_10a0 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_10a0 != local_5a8);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_d71);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_d6a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_d69);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_d61);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_d41);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_d39);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_d19);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_d11);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_cf2);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_cf1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan gettxspendingprevout()
{
    return RPCHelpMan{"gettxspendingprevout",
        "Scans the mempool to find transactions spending any of the given outputs",
        {
            {"outputs", RPCArg::Type::ARR, RPCArg::Optional::NO, "The transaction outputs that we want to check, and within each, the txid (string) vout (numeric).",
                {
                    {"", RPCArg::Type::OBJ, RPCArg::Optional::OMITTED, "",
                        {
                            {"txid", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The transaction id"},
                            {"vout", RPCArg::Type::NUM, RPCArg::Optional::NO, "The output number"},
                        },
                    },
                },
            },
        },
        RPCResult{
            RPCResult::Type::ARR, "", "",
            {
                {RPCResult::Type::OBJ, "", "",
                {
                    {RPCResult::Type::STR_HEX, "txid", "the transaction id of the checked output"},
                    {RPCResult::Type::NUM, "vout", "the vout value of the checked output"},
                    {RPCResult::Type::STR_HEX, "spendingtxid", /*optional=*/true, "the transaction id of the mempool transaction spending this output (omitted if unspent)"},
                }},
            }
        },
        RPCExamples{
            HelpExampleCli("gettxspendingprevout", "\"[{\\\"txid\\\":\\\"a08e6907dbbd3d809776dbfc5d82e371b764ed838b5655e72f463568df1aadf0\\\",\\\"vout\\\":3}]\"")
            + HelpExampleRpc("gettxspendingprevout", "\"[{\\\"txid\\\":\\\"a08e6907dbbd3d809776dbfc5d82e371b764ed838b5655e72f463568df1aadf0\\\",\\\"vout\\\":3}]\"")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            const UniValue& output_params = request.params[0].get_array();
            if (output_params.empty()) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, outputs are missing");
            }

            std::vector<COutPoint> prevouts;
            prevouts.reserve(output_params.size());

            for (unsigned int idx = 0; idx < output_params.size(); idx++) {
                const UniValue& o = output_params[idx].get_obj();

                RPCTypeCheckObj(o,
                                {
                                    {"txid", UniValueType(UniValue::VSTR)},
                                    {"vout", UniValueType(UniValue::VNUM)},
                                }, /*fAllowNull=*/false, /*fStrict=*/true);

                const Txid txid = Txid::FromUint256(ParseHashO(o, "txid"));
                const int nOutput{o.find_value("vout").getInt<int>()};
                if (nOutput < 0) {
                    throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, vout cannot be negative");
                }

                prevouts.emplace_back(txid, nOutput);
            }

            const CTxMemPool& mempool = EnsureAnyMemPool(request.context);
            LOCK(mempool.cs);

            UniValue result{UniValue::VARR};

            for (const COutPoint& prevout : prevouts) {
                UniValue o(UniValue::VOBJ);
                o.pushKV("txid", prevout.hash.ToString());
                o.pushKV("vout", (uint64_t)prevout.n);

                const CTransaction* spendingTx = mempool.GetConflictTx(prevout);
                if (spendingTx != nullptr) {
                    o.pushKV("spendingtxid", spendingTx->GetHash().ToString());
                }

                result.push_back(std::move(o));
            }

            return result;
        },
    };
}